

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

int __thiscall BpTree<int>::FindFirstKey(BpTree<int> *this,int k,Addr *p)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  Addr p_00;
  ulong uVar4;
  int iVar5;
  IndexNode<int> C;
  IndexNode<int> D;
  IndexNode<int> local_90;
  
  *p = this->RootAddr;
  IndexNode<int>::IndexNode(&C,this->N);
  IndexNode<int>::IndexNode(&D,this->N);
  FindNode(this,*p,&C);
  while( true ) {
    iVar2 = this->N;
    if (C.NodeState == '1') break;
    uVar1 = iVar2 - 1;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      if ((C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar4] != '1') ||
         (k <= C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar4])) {
        uVar3 = uVar4 & 0xffffffff;
        break;
      }
    }
    if (((uint)uVar3 == uVar1) ||
       (C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [uVar3] == '0')) {
LAB_0012cb41:
      p_00 = C.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar3];
      *p = p_00;
    }
    else if (C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar3] == k) {
      FindNode(this,C.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar3],&D);
      IndexNode<int>::IndexNode(&local_90,&D);
      iVar2 = HaveK(this,&local_90,k);
      IndexNode<int>::~IndexNode(&local_90);
      if (iVar2 == 0) {
        p_00 = C.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar3 + 1];
      }
      else {
        p_00 = C.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar3];
      }
      *p = p_00;
    }
    else {
      if (k < C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar3]) goto LAB_0012cb41;
      p_00 = *p;
    }
    FindNode(this,p_00,&C);
  }
  iVar5 = 1;
  if (1 < iVar2) {
    iVar5 = iVar2;
  }
  uVar1 = iVar5 - 1;
  uVar3 = 0;
  do {
    if (uVar1 == uVar3) {
LAB_0012cbf8:
      IndexNode<int>::~IndexNode(&D);
      IndexNode<int>::~IndexNode(&C);
      return uVar1;
    }
    if (k <= C.k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[uVar3]) {
      uVar1 = (uint)uVar3;
      goto LAB_0012cbf8;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int BpTree<K>::FindFirstKey(K k, Addr& p) {
	int i, pos;
	p = this->RootAddr;
	IndexNode<K> C(N);
	IndexNode<K> D(N);
	this->FindNode(p, C);
	while (C.NodeState != LEAF) {
		for (i = 0; i < N - 1 && C.v[i] == '1' && k > C.k[i]; i++);
		if (i == N - 1 || C.v[i] == '0') {
			p = C.p[i];
		}
		else if (k == C.k[i]) {
			this->FindNode(C.p[i], D);
			if (this->HaveK(D, k))
				p = C.p[i];			//���C.p[i]������k����C = this->FindNode(C.p[i]);
			else
				p = C.p[i + 1];		//���C.p[i]������k����C = this->FindNode(C.p[i + 1]);
		}
		else if (k < C.k[i]) {
			p = C.p[i];
		}
		this->FindNode(p, C);
	}
	for (pos = 0; pos < N - 1 && C.k[pos] < k; pos++);
	return pos;
}